

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object___defineGetter__(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val_00;
  undefined1 auVar1 [16];
  int iVar2;
  JSAtom JVar3;
  long in_R8;
  int in_R9D;
  JSValue JVar4;
  JSAtom atom;
  int flags;
  int ret;
  JSValue set;
  JSValue get;
  JSValue value;
  JSValue prop;
  JSValue obj;
  int64_t in_stack_00000100;
  undefined1 in_stack_00000108 [16];
  JSValue in_stack_00000220;
  JSValue in_stack_00000230;
  int in_stack_00000240;
  JSContext *in_stack_fffffffffffffef0;
  JSContext *ctx_00;
  JSValueUnion in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined4 uStack_c4;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  JSContext *in_stack_ffffffffffffff80;
  undefined4 uStack_14;
  undefined8 local_10;
  
  local_88 = *(JSValueUnion *)(in_R8 + 0x10);
  ctx_00 = *(JSContext **)(in_R8 + 0x18);
  JVar4 = JS_ToObject(in_stack_ffffffffffffff80,*(JSValue *)(in_R8 + 0x10));
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    JVar4.tag._0_4_ = in_stack_ffffffffffffff08;
    JVar4.u.ptr = (void *)in_stack_ffffffffffffff00;
    JVar4.tag._4_4_ = in_stack_ffffffffffffff0c;
    iVar2 = check_function((JSContext *)in_stack_fffffffffffffef8.ptr,JVar4);
    if (iVar2 == 0) {
      val_00.tag._0_4_ = in_stack_ffffffffffffff28;
      val_00.u = (JSValueUnion)in_stack_ffffffffffffff20;
      val_00.tag._4_4_ = in_stack_ffffffffffffff2c;
      JVar3 = JS_ValueToAtom((JSContext *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),val_00);
      if (JVar3 == 0) {
        v_00.tag = in_stack_ffffffffffffff00;
        v_00.u.ptr = in_stack_fffffffffffffef8.ptr;
        JS_FreeValue(in_stack_fffffffffffffef0,v_00);
        local_10 = 6;
      }
      else {
        if (in_R9D == 0) {
          local_98 = (void *)((ulong)in_stack_ffffffffffffff2c << 0x20);
          local_90 = (JSContext *)0x3;
        }
        else {
          local_98 = local_88;
          local_90 = ctx_00;
          local_88 = (void *)((ulong)uStack_c4 << 0x20);
          ctx_00 = (JSContext *)0x3;
        }
        val.tag = in_stack_00000100;
        val.u = (JSValueUnion)this_val.tag;
        iVar2 = JS_DefineProperty((JSContext *)this_val.u.ptr,(JSValue)in_stack_00000108,ctx._4_4_,
                                  val,in_stack_00000220,in_stack_00000230,in_stack_00000240);
        v_01.tag = (int64_t)local_90;
        v_01.u.float64 = local_98;
        JS_FreeValue(ctx_00,v_01);
        JS_FreeAtom(ctx_00,local_88._4_4_);
        if (iVar2 < 0) {
          local_10 = 6;
        }
        else {
          local_10 = 3;
        }
      }
    }
    else {
      v.tag = in_stack_ffffffffffffff00;
      v.u.ptr = in_stack_fffffffffffffef8.ptr;
      JS_FreeValue(in_stack_fffffffffffffef0,v);
      local_10 = 6;
    }
  }
  else {
    local_10 = 6;
  }
  auVar1._4_8_ = local_10;
  auVar1._0_4_ = uStack_14;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_object___defineGetter__(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv, int magic)
{
    JSValue obj;
    JSValueConst prop, value, get, set;
    int ret, flags;
    JSAtom atom;

    prop = argv[0];
    value = argv[1];

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    if (check_function(ctx, value)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    flags = JS_PROP_THROW |
        JS_PROP_HAS_ENUMERABLE | JS_PROP_ENUMERABLE |
        JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE;
    if (magic) {
        get = JS_UNDEFINED;
        set = value;
        flags |= JS_PROP_HAS_SET;
    } else {
        get = value;
        set = JS_UNDEFINED;
        flags |= JS_PROP_HAS_GET;
    }
    ret = JS_DefineProperty(ctx, obj, atom, JS_UNDEFINED, get, set, flags);
    JS_FreeValue(ctx, obj);
    JS_FreeAtom(ctx, atom);
    if (ret < 0) {
        return JS_EXCEPTION;
    } else {
        return JS_UNDEFINED;
    }
}